

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall despot::Parser::ParseStateTransitionTag(Parser *this,TiXmlHandle *handle)

{
  pointer pNVar1;
  CPT *pCVar2;
  int iVar3;
  TiXmlElement *pTVar4;
  undefined4 extraout_var;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  int a;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  reference rVar12;
  CPT *transition;
  CPT *noisy_variant;
  allocator<char> local_99;
  TiXmlHandle local_98;
  TiXmlHandle local_90;
  size_type local_88;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_80;
  ulong local_78;
  string local_70;
  string local_50;
  TiXmlHandle TVar5;
  
  util::tinyxml::TiXmlHandle::FirstChild(&local_90,(char *)handle);
  util::tinyxml::TiXmlHandle::FirstChild(&local_98,(char *)&local_90);
  pTVar4 = util::tinyxml::TiXmlHandle::ToElement(&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Cannot find StateTransitionFunction tag",
             (allocator<char> *)&local_98);
  Ensure(this,pTVar4 != (TiXmlElement *)0x0,&local_70,(TiXmlBase *)0x0);
  std::__cxx11::string::~string((string *)&local_70);
  pTVar4 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar4->super_TiXmlNode);
  for (; pTVar4 != (TiXmlElement *)0x0;
      pTVar4 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar4->super_TiXmlNode)) {
    local_98.node = (TiXmlNode *)CreateStateTransition(this,pTVar4);
    (*((Function *)&(local_98.node)->super_TiXmlBase)->_vptr_Function[0xf])(local_98.node);
    std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::push_back
              (&this->transition_funcs_,(value_type *)&local_98);
    if ((DAT_0019fe18 != 0.0) || (TVar5.node = local_98.node, NAN(DAT_0019fe18))) {
      iVar3 = (*((Function *)&(local_98.node)->super_TiXmlBase)->_vptr_Function[0x11])
                        (local_98.node);
      TVar5.node = (TiXmlNode *)CONCAT44(extraout_var,iVar3);
    }
    local_90.node = TVar5.node;
    std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::push_back
              (&this->noisy_transition_funcs_,(value_type *)&local_90);
    iVar3 = (*((Function *)&(local_98.node)->super_TiXmlBase)->_vptr_Function[0xc])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "In <StateTransitionFunction>: Probability distribution does not sum to one!",
               &local_99);
    Ensure(this,SUB41(iVar3,0),&local_50,(TiXmlBase *)pTVar4);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pNVar1 = (this->action_vars_).
           super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(this->transition_funcs_).
                        super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->transition_funcs_).
                       super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar10 = (ulong)((long)(pNVar1->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  *(long *)&(pNVar1->super_Variable).values_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data) >> 5;
  local_80 = &this->is_identity_;
  iVar3 = (int)uVar6;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize(local_80,(long)iVar3);
  iVar9 = (int)uVar10;
  local_88 = (size_type)iVar9;
  uVar11 = 0;
  uVar8 = 0;
  if (0 < iVar9) {
    uVar8 = uVar10 & 0xffffffff;
  }
  local_78 = uVar6 & 0xffffffff;
  if (iVar3 < 1) {
    local_78 = uVar11;
  }
  for (; uVar11 != local_78; uVar11 = uVar11 + 1) {
    std::vector<bool,_std::allocator<bool>_>::resize
              ((local_80->
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar11,local_88,false);
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      pCVar2 = (this->transition_funcs_).
               super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11];
      iVar3 = (*(pCVar2->super_Function)._vptr_Function[0x10])
                        (pCVar2,(this->action_vars_).
                                super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                ._M_impl.super__Vector_impl_data._M_start,uVar6 & 0xffffffff);
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((this->is_identity_).
                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar11,uVar6);
      puVar7 = rVar12._M_p;
      if ((char)iVar3 == '\0') {
        uVar10 = ~rVar12._M_mask & *puVar7;
      }
      else {
        uVar10 = rVar12._M_mask | *puVar7;
      }
      *puVar7 = uVar10;
    }
  }
  return;
}

Assistant:

void Parser::ParseStateTransitionTag(TiXmlHandle& handle) {
	TiXmlElement* e_StateTransition = handle.FirstChild("pomdpx").FirstChild(
		"StateTransitionFunction").ToElement();

	Ensure(e_StateTransition != NULL,
		"Cannot find StateTransitionFunction tag");

	TiXmlElement* e_CondProb = e_StateTransition->FirstChildElement();
	while (e_CondProb != 0) {
		CPT* transition = CreateStateTransition(e_CondProb);
		transition->ComputeSparseChildDistribution();
		transition_funcs_.push_back(transition);

		CPT* noisy_variant =
			Globals::config.noise ?
				transition->CreateNoisyVariant(Globals::config.noise) :
				transition;
		noisy_transition_funcs_.push_back(noisy_variant);

		Ensure(transition->Validate(),
			"In <StateTransitionFunction>: Probability distribution does not sum to one!",
			e_CondProb);

		e_CondProb = e_CondProb->NextSiblingElement();
	}

	// TODO: Check whether each state variable corresponds to one CondProb

	int num_states = transition_funcs_.size(), num_actions =
		action_vars_[0].Size();
	is_identity_.resize(num_states);
	for (int s = 0; s < num_states; s++) {
		is_identity_[s].resize(num_actions);
		for (int a = 0; a < num_actions; a++) {
			is_identity_[s][a] =
				transition_funcs_[s]->IsIdentityUnderConstraint(
					&action_vars_[0], a);
		}
	}
}